

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
* testing::
  A<std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>const&>
            (void)

{
  MatcherInterface<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
  *pMVar1;
  Matcher<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
  *in_RDI;
  
  pMVar1 = (MatcherInterface<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
            *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001ce6b8;
  (in_RDI->
  super_MatcherBase<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
  ).impl_.value_ = pMVar1;
  (in_RDI->
  super_MatcherBase<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
  ).impl_.link_.next_ =
       &(in_RDI->
        super_MatcherBase<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
        ).impl_.link_;
  (in_RDI->
  super_MatcherBase<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001ce680;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }